

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

void bcf_hdr_remove(bcf_hdr_t *hdr,int type,char *key)

{
  kh_vdict_t *h;
  uint uVar1;
  khint_t kVar2;
  bcf_hrec_t *pbVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char *__s1;
  int iVar7;
  int iVar9;
  uint uVar8;
  
  uVar5 = (ulong)(uint)type;
  if (type == 3) {
    uVar5 = 0;
  }
  do {
    if ((uint)type < 4) {
      pbVar3 = bcf_hdr_get_hrec(hdr,type,"ID",key,(char *)0x0);
      if (pbVar3 == (bcf_hrec_t *)0x0) {
        return;
      }
      uVar8 = hdr->nhrec;
      uVar4 = 0;
      if (0 < (int)uVar8) {
        uVar4 = (ulong)uVar8;
      }
      uVar6 = 0;
      while( true ) {
        if (uVar4 == uVar6) {
          __assert_fail("i<hdr->nhrec",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                        ,0x269,"void bcf_hdr_remove(bcf_hdr_t *, int, const char *)");
        }
        if (hdr->hrec[uVar6] == pbVar3) break;
        uVar6 = uVar6 + 1;
      }
      h = (kh_vdict_t *)hdr->dict[type == 3];
      kVar2 = kh_get_vdict(h,key);
      h->vals[kVar2].hrec[uVar5] = (bcf_hrec_t *)0x0;
    }
    else {
      uVar8 = hdr->nhrec;
      uVar6 = 0;
      if (0 < (int)uVar8) {
        uVar6 = (ulong)uVar8;
      }
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        pbVar3 = hdr->hrec[uVar4];
        if (pbVar3->type == type) {
          if (type == 5) {
            __s1 = pbVar3->key;
          }
          else {
            uVar1 = bcf_hrec_find_key(pbVar3,"ID");
            if ((int)uVar1 < 0) goto LAB_00112825;
            __s1 = pbVar3->vals[uVar1];
          }
          iVar7 = strcmp(__s1,key);
          if (iVar7 == 0) {
            uVar6 = uVar4 & 0xffffffff;
            break;
          }
        }
LAB_00112825:
      }
      if ((uint)uVar6 == uVar8) {
        return;
      }
      pbVar3 = hdr->hrec[uVar6];
    }
    iVar7 = uVar8 - 1;
    hdr->nhrec = iVar7;
    iVar9 = iVar7 - (int)uVar6;
    if (iVar9 != 0 && (int)uVar6 <= iVar7) {
      memmove(hdr->hrec + (uVar6 & 0xffffffff),hdr->hrec + (uVar6 & 0xffffffff) + 1,(long)iVar9 << 3
             );
    }
    bcf_hrec_destroy(pbVar3);
    hdr->dirty = 1;
  } while( true );
}

Assistant:

void bcf_hdr_remove(bcf_hdr_t *hdr, int type, const char *key)
{
    int i;
    bcf_hrec_t *hrec;
    while (1)
    {
        if ( type==BCF_HL_FLT || type==BCF_HL_INFO || type==BCF_HL_FMT || type== BCF_HL_CTG )
        {
            hrec = bcf_hdr_get_hrec(hdr, type, "ID", key, NULL);
            if ( !hrec ) return;

            for (i=0; i<hdr->nhrec; i++)
                if ( hdr->hrec[i]==hrec ) break;
            assert( i<hdr->nhrec );

            vdict_t *d = type==BCF_HL_CTG ? (vdict_t*)hdr->dict[BCF_DT_CTG] : (vdict_t*)hdr->dict[BCF_DT_ID];
            khint_t k = kh_get(vdict, d, key);
            kh_val(d, k).hrec[type==BCF_HL_CTG?0:type] = NULL;
        }
        else
        {
            for (i=0; i<hdr->nhrec; i++)
            {
                if ( hdr->hrec[i]->type!=type ) continue;
                if ( type==BCF_HL_GEN )
                {
                    if ( !strcmp(hdr->hrec[i]->key,key) ) break;
                }
                else
                {
                    // not all structured lines have ID, we could be more sophisticated as in bcf_hdr_get_hrec()
                    int j = bcf_hrec_find_key(hdr->hrec[i], "ID");
                    if ( j>=0 && !strcmp(hdr->hrec[i]->vals[j],key) ) break;
                }
            }
            if ( i==hdr->nhrec ) return;
            hrec = hdr->hrec[i];
        }

        hdr->nhrec--;
        if ( i < hdr->nhrec )
            memmove(&hdr->hrec[i],&hdr->hrec[i+1],(hdr->nhrec-i)*sizeof(bcf_hrec_t*));
        bcf_hrec_destroy(hrec);
        hdr->dirty = 1;
    }
}